

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

char16_t * strcpyU16(char16_t *s1,char16_t *s2)

{
  char16_t *pcVar1;
  char16_t cVar2;
  
  pcVar1 = s1;
  if (s2 != (char16_t *)0x0 && s1 != (char16_t *)0x0) {
    cVar2 = *s2;
    do {
      s2 = s2 + (cVar2 != 0);
      *s1 = cVar2;
      s1 = s1 + 1;
      cVar2 = *s2;
    } while (cVar2 != 0);
  }
  return pcVar1;
}

Assistant:

char16_t *strcpyU16(char16_t *s1, const char16_t *s2)
{
	if (s1 == NULL || s2 == NULL)
	{
		return s1;
	}
	char16_t *p1 = s1;
	char16_t *p2 = (char16_t *)s2;
	do
	{
		*p1++ = (*p2) ? *p2++ : u'\0';
	} while (*p2);
	return s1;
}